

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O3

bool __thiscall
units::uncertain_measurement::operator==(uncertain_measurement *this,measurement *other)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  double dVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  dVar4 = measurement::value_as(other,&this->units_);
  fVar5 = (float)dVar4;
  fVar1 = this->value_;
  fVar6 = this->uncertainty_;
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    bVar2 = fVar5 <= fVar6 + fVar1 && fVar1 - fVar6 <= fVar5;
  }
  else {
    bVar2 = true;
    if ((fVar1 != fVar5) || (NAN(fVar1) || NAN(fVar5))) {
      fVar6 = fVar1 - fVar5;
      if (((fVar6 != 0.0) || (NAN(fVar6))) &&
         ((NAN(fVar6) || ((uint)ABS(fVar6) < 0x7f800001 && ((uint)fVar6 & 0x7f800000) != 0)))) {
        fVar6 = (float)((int)fVar1 + 8U & 0xfffffff0);
        fVar7 = (float)((int)fVar5 + 8U & 0xfffffff0);
        if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
          fVar3 = (float)((int)(fVar5 * 1.0000005) + 8U & 0xfffffff0);
          if ((fVar6 != fVar3) || (NAN(fVar6) || NAN(fVar3))) {
            fVar5 = (float)((int)(fVar5 * 0.9999995) + 8U & 0xfffffff0);
            if ((fVar6 != fVar5) || (NAN(fVar6) || NAN(fVar5))) {
              fVar6 = (float)((int)(fVar1 * 1.0000005) + 8U & 0xfffffff0);
              if ((fVar7 != fVar6) || (NAN(fVar7) || NAN(fVar6))) {
                bVar2 = fVar7 == (float)((int)(fVar1 * 0.9999995) + 8U & 0xfffffff0);
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = static_cast<float>(other.value_as(units_));
        if (uncertainty_ == 0.0F) {
            return (value_ == val) ? true :
                                     detail::compare_round_equals(value_, val);
        }
        return (
            val >= (value_ - uncertainty_) && val <= (value_ + uncertainty_));
    }